

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtration_algorithms.h
# Opt level: O1

value_t __thiscall
pmoment_filtration::compute_filtration
          (pmoment_filtration *this,unsigned_short dimension,directed_flag_complex_cell_t *param_2,
          filtered_directed_graph_t *param_3,value_t *boundary_filtration)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined2 in_register_00000032;
  value_t EXPRESSION_0;
  float fVar4;
  float fVar5;
  value_t sum;
  float fVar6;
  
  uVar1 = (ulong)(CONCAT22(in_register_00000032,dimension) + 1);
  fVar4 = 0.0;
  uVar2 = 0;
  do {
    fVar5 = boundary_filtration[uVar2];
    if ((uVar2 != 0) && (fVar5 <= fVar4)) {
      fVar5 = fVar4;
    }
    fVar4 = fVar5;
    uVar2 = uVar2 + 1;
  } while (uVar1 != uVar2);
  fVar5 = 0.0;
  uVar2 = 0;
  do {
    uVar3 = 0;
    fVar6 = 0.0;
    do {
      fVar6 = fVar6 + boundary_filtration[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    fVar6 = boundary_filtration[uVar2] - fVar6 / ((float)dimension + 1.0);
    fVar5 = fVar5 + fVar6 * fVar6;
    uVar2 = uVar2 + 1;
  } while (uVar2 != uVar1);
  fVar5 = powf(fVar5,0.5);
  return fVar5 / ((float)dimension + 1.0) + fVar4;
}

Assistant:

inline value_t max(T values, int from, int to) {
	value_t max = 0;
	for (int index = from; index <= to; index++) {
		value_t next_value = values[index];
		max = index == 0 || next_value > max ? next_value : max;
	}

	return max;
}